

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O2

bool duckdb::Equals::Operation<double>(double *left,double *right)

{
  bool bVar1;
  
  bVar1 = EqualsFloat<double>(*left,*right);
  return bVar1;
}

Assistant:

bool Equals::Operation(const double &left, const double &right) {
	return EqualsFloat<double>(left, right);
}